

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_transient.h
# Opt level: O2

void immutable::rrb_details::ensure_size_table_editable<char,false,5>
               (ref<immutable::rrb_details::rrb_size_table<false>_> *table,uint32_t len,
               guid_type guid)

{
  rrb_size_table<false> *prVar1;
  ref<immutable::rrb_details::rrb_size_table<false>_> local_20;
  
  prVar1 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->(table);
  if (prVar1->guid != guid) {
    local_20.ptr = transient_size_table_clone<5,false>(table->ptr,len,guid);
    if (local_20.ptr != (rrb_size_table<false> *)0x0) {
      (local_20.ptr)->_ref_count = 1;
    }
    ref<immutable::rrb_details::rrb_size_table<false>_>::operator=(table,&local_20);
    release(local_20.ptr);
  }
  return;
}

Assistant:

inline void ensure_size_table_editable(ref<rrb_size_table<atomic_ref_counting>>& table, uint32_t len, guid_type guid)
      {
      if (table->guid != guid)
        {
        table = transient_size_table_clone<N>(table.ptr, len, guid);
        }
      }